

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_gej_neg(secp256k1_gej *r,secp256k1_gej *a)

{
  secp256k1_gej *in_RSI;
  void *in_RDI;
  secp256k1_fe *in_stack_ffffffffffffffe8;
  
  secp256k1_gej_verify(in_RSI);
  *(int *)((long)in_RDI + 0x90) = in_RSI->infinity;
  memcpy(in_RDI,in_RSI,0x30);
  memcpy((void *)((long)in_RDI + 0x30),&in_RSI->y,0x30);
  memcpy((void *)((long)in_RDI + 0x60),&in_RSI->z,0x30);
  secp256k1_fe_normalize_weak((secp256k1_fe *)0x10db78);
  secp256k1_fe_negate_unchecked(&in_RSI->x,in_stack_ffffffffffffffe8,0);
  secp256k1_gej_verify(in_RSI);
  return;
}

Assistant:

static void secp256k1_gej_neg(secp256k1_gej *r, const secp256k1_gej *a) {
    SECP256K1_GEJ_VERIFY(a);

    r->infinity = a->infinity;
    r->x = a->x;
    r->y = a->y;
    r->z = a->z;
    secp256k1_fe_normalize_weak(&r->y);
    secp256k1_fe_negate(&r->y, &r->y, 1);

    SECP256K1_GEJ_VERIFY(r);
}